

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_bbdpre.c
# Opt level: O0

int CVBBDPrecReInit(void *cvode_mem,sunindextype mudq,sunindextype mldq,sunrealtype dqrely)

{
  long *plVar1;
  long in_RDX;
  long in_RSI;
  CVodeMem in_RDI;
  double in_XMM0_Qa;
  sunindextype Nlocal;
  CVBBDPrecData pdata;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  double local_98;
  double local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_68;
  long local_60;
  long local_58;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-1,0x13a,"CVBBDPrecReInit",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_bbdpre.c"
                   ,"Integrator memory is NULL.");
    local_4 = -1;
  }
  else if (in_RDI->cv_lmem == (void *)0x0) {
    cvProcessError(in_RDI,-2,0x143,"CVBBDPrecReInit",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_bbdpre.c"
                   ,
                   "Linear solver memory is NULL. One of the SPILS linear solvers must be attached."
                  );
    local_4 = -2;
  }
  else if (*(long *)((long)in_RDI->cv_lmem + 0xf0) == 0) {
    cvProcessError(in_RDI,-5,0x14c,"CVBBDPrecReInit",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_bbdpre.c"
                   ,"BBD peconditioner memory is NULL. CVBBDPrecInit must be called.");
    local_4 = -5;
  }
  else {
    plVar1 = *(long **)((long)in_RDI->cv_lmem + 0xf0);
    local_80 = plVar1[0xf];
    local_58 = in_RSI;
    if (in_RSI < 0) {
      local_58 = 0;
    }
    if (local_80 + -1 < local_58) {
      local_60 = local_80 + -1;
    }
    else {
      local_68 = in_RSI;
      if (in_RSI < 0) {
        local_68 = 0;
      }
      local_60 = local_68;
    }
    *plVar1 = local_60;
    local_78 = in_RDX;
    if (in_RDX < 0) {
      local_78 = 0;
    }
    if (local_80 + -1 < local_78) {
      local_80 = local_80 + -1;
    }
    else {
      local_88 = in_RDX;
      if (in_RDX < 0) {
        local_88 = 0;
      }
      local_80 = local_88;
    }
    plVar1[1] = local_80;
    local_90 = in_XMM0_Qa;
    if (in_XMM0_Qa <= 0.0) {
      if (0.0 < in_RDI->cv_uround) {
        local_98 = sqrt(in_RDI->cv_uround);
      }
      else {
        local_98 = 0.0;
      }
      local_90 = local_98;
    }
    plVar1[4] = (long)local_90;
    plVar1[0x12] = 0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVBBDPrecReInit(void* cvode_mem, sunindextype mudq, sunindextype mldq,
                    sunrealtype dqrely)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  CVBBDPrecData pdata;
  sunindextype Nlocal;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CVLS_MEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBBD_MEM_NULL);
    return (CVLS_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Test if the LS linear solver interface has been created */
  if (cv_mem->cv_lmem == NULL)
  {
    cvProcessError(cv_mem, CVLS_LMEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBBD_LMEM_NULL);
    return (CVLS_LMEM_NULL);
  }
  cvls_mem = (CVLsMem)cv_mem->cv_lmem;

  /* Test if the preconditioner data is non-NULL */
  if (cvls_mem->P_data == NULL)
  {
    cvProcessError(cv_mem, CVLS_PMEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBBD_PMEM_NULL);
    return (CVLS_PMEM_NULL);
  }
  pdata = (CVBBDPrecData)cvls_mem->P_data;

  /* Load half-bandwidths */
  Nlocal      = pdata->n_local;
  pdata->mudq = SUNMIN(Nlocal - 1, SUNMAX(0, mudq));
  pdata->mldq = SUNMIN(Nlocal - 1, SUNMAX(0, mldq));

  /* Set pdata->dqrely based on input dqrely (0 implies default). */
  pdata->dqrely = (dqrely > ZERO) ? dqrely : SUNRsqrt(cv_mem->cv_uround);

  /* Re-initialize nge */
  pdata->nge = 0;

  return (CVLS_SUCCESS);
}